

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O3

int nn_xsurveyor_recv(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  
  uVar2 = nn_fq_recv((nn_fq *)&self[2].sock,msg,(nn_pipe **)0x0);
  if ((-1 < (int)uVar2) && (uVar1 = uVar2 & 2, uVar2 = 0, uVar1 == 0)) {
    sVar3 = nn_chunkref_size(&msg->body);
    if (sVar3 < 4) {
      nn_msg_term(msg);
      uVar2 = 0xfffffff5;
    }
    else {
      sVar3 = nn_chunkref_size(&msg->sphdr);
      if (sVar3 != 0) {
        nn_xsurveyor_recv_cold_1();
      }
      nn_xsurveyor_recv_cold_2();
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int nn_xsurveyor_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xsurveyor *xsurveyor;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    rc = nn_fq_recv (&xsurveyor->inpipes, msg, NULL);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {
        if (nn_slow (nn_chunkref_size (&msg->body) < sizeof (uint32_t))) {
            nn_msg_term (msg);
            return -EAGAIN;
        }
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), nn_chunkref_data (&msg->body),
           sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, sizeof (uint32_t));
    }

    return 0;
}